

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  TypeID id;
  ID id_00;
  CompilerMSL *pCVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BuiltIn BVar6;
  ExecutionModel EVar7;
  uint32_t uVar8;
  SPIRType *pSVar9;
  uint7 extraout_var;
  SPIRConstant *pSVar10;
  undefined7 extraout_var_00;
  CompilerError *this_00;
  uint *ts_1;
  uint32_t mbr_idx;
  uint index;
  ulong uVar11;
  SPIRVariable *pSVar12;
  ulong uVar13;
  BuiltIn builtin;
  SPIRType *local_278;
  undefined4 local_26c;
  uint local_268;
  uint32_t var_mbr_idx;
  CompilerMSL *local_260;
  undefined4 local_254;
  uint local_250;
  uint32_t location;
  string *local_248;
  SPIRType *local_240;
  ulong local_238;
  uint32_t initializer;
  undefined8 local_228;
  InterfaceBlockMeta *local_220;
  SPIRVariable *local_218;
  undefined4 local_20c;
  ulong local_208;
  uint32_t var_id;
  uint32_t ptr_type_id;
  SmallVector<unsigned_int,_8UL> *local_1c0;
  ParsedIR *local_1b8;
  SPIRFunction *local_1b0;
  string var_name;
  SPIRType ptr_type;
  
  pSVar12 = var;
  local_248 = ib_var_ref;
  local_240 = ib_type;
  local_1b0 = Compiler::get<spirv_cross::SPIRFunction>
                        ((Compiler *)this,
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  if (meta->strip_array == true) {
    pSVar9 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    pSVar9 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar2 = Compiler::is_builtin_variable((Compiler *)this,var);
  BVar6 = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,BuiltIn);
  builtin = BVar6;
  local_278 = pSVar9;
  bVar3 = Compiler::has_decoration((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,Block);
  if (storage == Output) {
    bVar4 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
    if (bVar4) {
      emit_local_masked_variable(this,var,meta->strip_array);
      return;
    }
LAB_002500c1:
    local_26c = 0;
  }
  else {
    if (storage != Input) goto LAB_002500c1;
    bVar4 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
    local_26c = (undefined4)CONCAT71((int7)((ulong)ib_type >> 8),1);
    if (bVar4) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"PerVertexKHR decoration is not supported in MSL.");
      goto LAB_00250994;
    }
  }
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  local_260 = this;
  if (local_278->basetype == Struct) {
    bVar4 = variable_storage_requires_stage_io(this,storage);
    if ((!bVar4) && (bVar3)) {
      bVar4 = (local_278->array).super_VectorView<unsigned_int>.buffer_size == 0;
    }
    local_20c = (undefined4)CONCAT71(extraout_var & 0xffffff,1);
    if ((!bVar2 && bVar4 == true) && (meta->allow_local_declaration == true)) {
      emit_local_masked_variable(this,var,meta->strip_array);
      local_20c = 0;
    }
    pSVar9 = local_278;
    if (bVar4 == false) {
LAB_0025028e:
      add_plain_variable_to_interface_block(this,storage,local_248,local_240,var,meta);
      return;
    }
    location = 0xffffffff;
    var_mbr_idx = 0;
    bVar2 = Compiler::is_matrix((Compiler *)this,local_278);
    bVar4 = Compiler::is_array((Compiler *)this,pSVar9);
    if (bVar2) {
      if (bVar4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"MSL cannot emit arrays-of-matrices in input and output variables.");
LAB_00250994:
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_268 = local_278->columns;
    }
    else if (bVar4) {
      if ((local_278->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"MSL cannot emit arrays-of-arrays in input and output variables.");
        goto LAB_00250994;
      }
      local_268 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_278);
    }
    else {
      local_268 = 1;
    }
    local_1b8 = &(this->super_CompilerGLSL).super_Compiler.ir;
    local_1c0 = &this->vars_needing_early_declaration;
    uVar11 = 0;
    local_228 = 0;
    local_220 = meta;
    local_218 = var;
    for (local_250 = 0; local_250 < local_268; local_250 = local_250 + 1) {
      for (uVar13 = 0; pSVar9 = local_278,
          uVar13 < (uint)(local_278->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          uVar13 = uVar13 + 1) {
        builtin = BuiltInMax;
        local_238 = uVar11;
        bVar2 = Compiler::is_member_builtin((Compiler *)this,local_278,(uint32_t)uVar13,&builtin);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,
                            (pSVar9->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar13].id);
        if ((storage == Output) &&
           (bVar4 = CompilerGLSL::is_stage_output_block_member_masked
                              (&this->super_CompilerGLSL,var,(uint32_t)uVar13,meta->strip_array),
           bVar4)) {
          location = 0xffffffff;
          local_228._0_1_ = (byte)local_228 | bVar3;
          if (bVar2) {
            uVar8 = (uint32_t)local_238;
            if (meta->strip_array != false) goto LAB_002507f5;
            ptr_type_id = ParsedIR::increase_bound_by(local_1b8,2);
            var_id = ptr_type_id + 1;
            SPIRType::SPIRType(&ptr_type,pSVar9);
            ptr_type.pointer = true;
            ptr_type.pointer_depth = ptr_type.pointer_depth + 1;
            ptr_type.parent_type.id =
                 (local_278->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar13].id;
            initializer = 0;
            ptr_type.storage = Output;
            uVar8 = (var->initializer).id;
            if ((uVar8 != 0) &&
               (pSVar10 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar8),
               pSVar10 != (SPIRConstant *)0x0)) {
              initializer = (pSVar10->subconstants).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                            [uVar13].id;
            }
            Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                      ((Compiler *)this,ptr_type_id,&ptr_type);
            var_name._M_dataplus._M_p._0_4_ = 3;
            pSVar12 = (SPIRVariable *)&initializer;
            Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                      ((Compiler *)this,var_id,&ptr_type_id,(StorageClass *)&var_name,
                       (uint *)pSVar12);
            SPIRFunction::add_local_variable(local_1b0,(VariableID)var_id);
            SmallVector<unsigned_int,_8UL>::push_back(local_1c0,&var_id);
            uVar8 = var_id;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&var_name,this,(ulong)builtin,3);
            Compiler::set_name((Compiler *)this,(ID)uVar8,&var_name);
            ::std::__cxx11::string::~string((string *)&var_name);
            Compiler::set_decoration((Compiler *)this,(ID)var_id,BuiltIn,builtin);
            SPIRType::~SPIRType(&ptr_type);
          }
LAB_00250588:
          uVar8 = (uint32_t)local_238;
        }
        else {
          if ((bVar2) &&
             (bVar4 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), !bVar4))
          goto LAB_00250588;
          bVar4 = Compiler::is_matrix((Compiler *)this,pSVar9);
          local_208 = uVar13;
          if ((bVar4) || (bVar4 = Compiler::is_array((Compiler *)this,pSVar9), bVar4)) {
            local_254 = 0;
          }
          else {
            local_254 = (undefined4)CONCAT71(extraout_var_00,pSVar9->basetype != Struct);
          }
          bVar4 = true;
          if ((byte)local_26c != '\0') {
            EVar7 = Compiler::get_execution_model((Compiler *)local_260);
            bVar4 = EVar7 == ExecutionModelFragment;
          }
          pCVar1 = local_260;
          bVar5 = variable_storage_requires_stage_io(local_260,storage);
          BVar6 = builtin;
          ts_1 = (uint *)0x1;
          (*(pCVar1->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&var_name,pCVar1,(ulong)(local_218->super_IVariant).self.id);
          ::std::__cxx11::string::string((string *)&ptr_type_id,(string *)&var_name);
          ::std::__cxx11::string::string((string *)&var_id,(string *)&var_name);
          pSVar9 = local_278;
          if (1 < local_268) {
            join<char_const(&)[2],unsigned_int&>
                      ((string *)&ptr_type,(spirv_cross *)0x38a666,(char (*) [2])&local_250,ts_1);
            ::std::__cxx11::string::append((string *)&ptr_type_id);
            ::std::__cxx11::string::~string((string *)&ptr_type);
            join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&ptr_type,(spirv_cross *)0x349808,(char (*) [2])&local_250,
                       (uint *)0x38a005,(char (*) [2])pSVar12);
            ::std::__cxx11::string::append((string *)&var_id);
            ::std::__cxx11::string::~string((string *)&ptr_type);
          }
          uVar13 = local_208;
          var = local_218;
          meta = local_220;
          pSVar12 = local_218;
          if (((~bVar5 | (byte)local_254) & 1) == 0 &&
              (bVar2 & bVar4 & BVar6 - BuiltInVertexId < 0xfffffffe) == 0) {
            ptr_type.super_IVariant._vptr_IVariant = (_func_int **)0x0;
            ptr_type.super_IVariant._8_8_ = &ptr_type.array.stack_storage;
            ptr_type.basetype = Void;
            ptr_type.width = 0;
            ptr_type.vecsize = 0;
            ptr_type.columns = 0;
            ptr_type.array.super_VectorView<unsigned_int>.ptr = (uint *)0x0;
            ptr_type.array.super_VectorView<unsigned_int>.buffer_size = 0x3f800000;
            ptr_type.array.buffer_capacity = 0;
            ptr_type.array.stack_storage.aligned_char[0] = '\0';
            ptr_type.array.stack_storage.aligned_char[1] = '\0';
            ptr_type.array.stack_storage.aligned_char[2] = '\0';
            ptr_type.array.stack_storage.aligned_char[3] = '\0';
            ptr_type.array.stack_storage.aligned_char[4] = '\0';
            ptr_type.array.stack_storage.aligned_char[5] = '\0';
            ptr_type.array.stack_storage.aligned_char[6] = '\0';
            ptr_type.array.stack_storage.aligned_char[7] = '\0';
            add_composite_member_variable_to_interface_block
                      (local_260,storage,local_248,local_240,local_218,pSVar9,(uint32_t)local_208,
                       local_220,(string *)&ptr_type_id,(string *)&var_id,&location,&var_mbr_idx,
                       (Bitset *)&ptr_type);
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&ptr_type.super_IVariant.self);
            uVar8 = var_mbr_idx;
          }
          else {
            add_plain_member_variable_to_interface_block
                      (local_260,storage,local_248,local_240,local_218,pSVar9,(uint32_t)local_208,
                       local_220,(string *)&ptr_type_id,(string *)&var_id,&location,&var_mbr_idx);
            uVar8 = (uint32_t)local_238;
          }
          ::std::__cxx11::string::~string((string *)&var_id);
          ::std::__cxx11::string::~string((string *)&ptr_type_id);
          ::std::__cxx11::string::~string((string *)&var_name);
          this = local_260;
        }
LAB_002507f5:
        var_mbr_idx = uVar8 + 1;
        uVar11 = (ulong)var_mbr_idx;
      }
    }
    if ((((byte)local_20c & (byte)local_228) != 0) &&
       ((bVar2 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar2 ||
        (bVar2 = is_tesc_shader(this), bVar2)))) {
      bVar2 = Compiler::is_builtin_variable((Compiler *)this,var);
      if (bVar2) {
        for (index = 0; id.id = (local_278->super_IVariant).self.id,
            index < (uint)(local_278->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
            ; index = index + 1) {
          uVar8 = Compiler::get_member_decoration((Compiler *)this,id,index,BuiltIn);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                    (&ptr_type,this,(ulong)uVar8,3);
          Compiler::set_member_name((Compiler *)this,id,index,(string *)&ptr_type);
          ::std::__cxx11::string::~string((string *)&ptr_type);
        }
        ::std::__cxx11::string::string((string *)&ptr_type,"gl_PerVertex",(allocator *)&var_name);
        Compiler::set_name((Compiler *)this,(ID)id.id,(string *)&ptr_type);
        meta = local_220;
        ::std::__cxx11::string::~string((string *)&ptr_type);
        id_00.id = (var->super_IVariant).self.id;
        ::std::__cxx11::string::string((string *)&ptr_type,"gl_out_masked",(allocator *)&var_name);
        Compiler::set_name((Compiler *)this,id_00,(string *)&ptr_type);
        ::std::__cxx11::string::~string((string *)&ptr_type);
        (this->stage_out_masked_builtin_type_id).id = (local_278->super_IVariant).self.id;
      }
      emit_local_masked_variable(this,var,meta->strip_array);
    }
  }
  else {
    bVar3 = is_tese_shader(this);
    if (((bVar3 & (byte)local_26c) == 1) &&
       ((~meta->strip_array & bVar2 & BVar6 - BuiltInTessLevelOuter < 2) == 1)) {
      add_tess_level_input_to_interface_block(this,local_248,local_240,var);
      return;
    }
    if (((local_278->basetype < (Image|UInt)) &&
        ((0x8077fcU >> (local_278->basetype & (Image|Struct)) & 1) != 0)) &&
       ((!bVar2 || (bVar3 = Compiler::has_active_builtin((Compiler *)this,BVar6,storage), bVar3))))
    {
      pSVar9 = local_278;
      bVar3 = Compiler::is_matrix((Compiler *)this,local_278);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        bVar3 = Compiler::is_array((Compiler *)this,pSVar9);
        bVar3 = !bVar3;
      }
      bVar4 = variable_storage_requires_stage_io(this,storage);
      bVar5 = true;
      if ((byte)local_26c != '\0') {
        EVar7 = Compiler::get_execution_model((Compiler *)local_260);
        bVar5 = EVar7 == ExecutionModelFragment;
      }
      this = local_260;
      if ((!bVar3 && bVar4) && (bVar2 & bVar5 & BVar6 - BuiltInVertexId < 0xfffffffe) == 0) {
        add_composite_variable_to_interface_block(local_260,storage,local_248,local_240,var,meta);
        return;
      }
      goto LAB_0025028e;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx, {});
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}